

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mllr_io.c
# Opt level: O1

int32 free_mllr_reg(float32 *****regl,float32 ****regr,uint32 n_class,uint32 n_stream)

{
  ulong uVar1;
  ulong uVar2;
  
  if (n_class != 0) {
    uVar2 = 0;
    do {
      if (n_stream != 0) {
        uVar1 = 0;
        do {
          ckd_free_3d(regl[uVar2][uVar1]);
          ckd_free_2d(regr[uVar2][uVar1]);
          uVar1 = uVar1 + 1;
        } while (n_stream != uVar1);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != n_class);
  }
  ckd_free_2d(regl);
  ckd_free_2d(regr);
  return 0;
}

Assistant:

int32
free_mllr_reg(float32 *****regl,
              float32 ****regr,
              uint32  n_class,
              uint32  n_stream)
{
    uint32 i,j;

    for (i=0; i < n_class; i++) {
        for (j=0; j < n_stream; j++) {
            ckd_free_3d((void ***)regl[i][j]);
            ckd_free_2d((void **)regr[i][j]);
        }
    }
    ckd_free_2d((void **)regl);
    ckd_free_2d((void **)regr);

    return S3_SUCCESS;
}